

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

void __thiscall SQCompiler::DoWhileStatement(SQCompiler *this)

{
  SQUnsignedInteger *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger SVar3;
  ulong uVar4;
  SQInteger SVar5;
  longlong *plVar6;
  ulong uVar7;
  long lVar8;
  SQFuncState *pSVar9;
  SQUnsignedInteger SVar10;
  SQFuncState *pSVar11;
  long lVar12;
  SQScope __oldscope__;
  SQInstruction local_58;
  SQUnsignedInteger local_50;
  SQInteger local_48;
  SQInteger SStack_40;
  
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  pSVar9 = this->_fs;
  SVar2 = (pSVar9->_instructions)._size;
  SVar3 = (pSVar9->_unresolvedbreaks)._size;
  local_50 = (pSVar9->_unresolvedcontinues)._size;
  uVar4 = (pSVar9->_breaktargets)._allocated;
  uVar7 = (pSVar9->_breaktargets)._size;
  plVar6 = (pSVar9->_breaktargets)._vals;
  pSVar11 = pSVar9;
  if (uVar4 <= uVar7) {
    SVar10 = 4;
    if (uVar7 * 2 != 0) {
      SVar10 = uVar7 * 2;
    }
    plVar6 = (longlong *)sq_vm_realloc(plVar6,uVar4 << 3,SVar10 * 8);
    (pSVar9->_breaktargets)._vals = plVar6;
    (pSVar9->_breaktargets)._allocated = SVar10;
    uVar7 = (pSVar9->_breaktargets)._size;
    pSVar11 = this->_fs;
  }
  (pSVar9->_breaktargets)._size = uVar7 + 1;
  plVar6[uVar7] = 0;
  uVar4 = (pSVar11->_continuetargets)._allocated;
  plVar6 = (pSVar11->_continuetargets)._vals;
  uVar7 = (pSVar11->_continuetargets)._size;
  pSVar9 = pSVar11;
  if (uVar4 <= uVar7) {
    SVar10 = 4;
    if (uVar7 * 2 != 0) {
      SVar10 = uVar7 * 2;
    }
    plVar6 = (longlong *)sq_vm_realloc(plVar6,uVar4 << 3,SVar10 * 8);
    (pSVar11->_continuetargets)._vals = plVar6;
    (pSVar11->_continuetargets)._allocated = SVar10;
    uVar7 = (pSVar11->_continuetargets)._size;
    pSVar9 = this->_fs;
  }
  (pSVar11->_continuetargets)._size = uVar7 + 1;
  plVar6[uVar7] = 0;
  local_48 = (this->_scope).outers;
  SStack_40 = (this->_scope).stacksize;
  (this->_scope).outers = pSVar9->_outers;
  SVar5 = SQFuncState::GetStackSize(pSVar9);
  (this->_scope).stacksize = SVar5;
  Statement(this,true);
  lVar8 = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  lVar12 = (this->_scope).stacksize;
  if (SVar5 != lVar12) {
    SQFuncState::SetStackSize(this->_fs,lVar12);
    if (lVar8 != this->_fs->_outers) {
      local_58._arg1 = (SQInt32)(this->_scope).stacksize;
      local_58.op = '<';
      local_58._arg0 = '\0';
      local_58._arg2 = '\0';
      local_58._arg3 = '\0';
      SQFuncState::AddInstruction(this->_fs,&local_58);
    }
  }
  (this->_scope).outers = local_48;
  (this->_scope).stacksize = SStack_40;
  Expect(this,0x112);
  SVar10 = (this->_fs->_instructions)._size;
  Expect(this,0x28);
  CommaExpr(this);
  Expect(this,0x29);
  pSVar9 = this->_fs;
  SVar5 = SQFuncState::PopTarget(pSVar9);
  local_58._arg0 = (char)SVar5;
  local_58.op = 0x1e;
  local_58._arg1 = 1;
  local_58._6_2_ = 0;
  SQFuncState::AddInstruction(pSVar9,&local_58);
  local_58._arg1 = (int)SVar2 + ~(uint)(this->_fs->_instructions)._size;
  local_58.op = '\x1c';
  local_58._arg0 = '\0';
  local_58._arg2 = '\0';
  local_58._arg3 = '\0';
  SQFuncState::AddInstruction(this->_fs,&local_58);
  pSVar9 = this->_fs;
  lVar12 = (pSVar9->_unresolvedbreaks)._size - SVar3;
  lVar8 = (pSVar9->_unresolvedcontinues)._size - local_50;
  if (0 < lVar8) {
    ResolveContinues(this,pSVar9,lVar8,SVar10 - 1);
    pSVar9 = this->_fs;
  }
  if (0 < lVar12) {
    ResolveBreaks(this,pSVar9,lVar12);
    pSVar9 = this->_fs;
  }
  pSVar1 = &(pSVar9->_breaktargets)._size;
  *pSVar1 = *pSVar1 - 1;
  pSVar1 = &(pSVar9->_continuetargets)._size;
  *pSVar1 = *pSVar1 - 1;
  return;
}

Assistant:

void DoWhileStatement()
    {
        Lex();
        SQInteger jmptrg = _fs->GetCurrentPos();
        BEGIN_BREAKBLE_BLOCK()
        BEGIN_SCOPE();
        Statement();
        END_SCOPE();
        Expect(TK_WHILE);
        SQInteger continuetrg = _fs->GetCurrentPos();
        Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget(), 1);
        _fs->AddInstruction(_OP_JMP, 0, jmptrg - _fs->GetCurrentPos() - 1);
        END_BREAKBLE_BLOCK(continuetrg);
    }